

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_miniz.h
# Opt level: O0

mz_ulong buminiz::mz_adler32(mz_ulong adler,uchar *ptr,size_t buf_len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t block_len;
  mz_uint32 s2;
  mz_uint32 s1;
  mz_uint32 i;
  size_t buf_len_local;
  uchar *ptr_local;
  mz_ulong adler_local;
  ulong local_8;
  
  s1 = (uint)adler & 0xffff;
  s2 = (mz_uint32)(adler >> 0x10);
  block_len = buf_len % 0x15b0;
  buf_len_local = buf_len;
  ptr_local = ptr;
  if (ptr == (uchar *)0x0) {
    local_8 = 1;
  }
  else {
    while (buf_len_local != 0) {
      for (i = 0; i + 7 < block_len; i = i + 8) {
        iVar1 = *ptr_local + s1;
        iVar2 = (uint)ptr_local[1] + iVar1;
        iVar3 = (uint)ptr_local[2] + iVar2;
        iVar4 = (uint)ptr_local[3] + iVar3;
        iVar5 = (uint)ptr_local[4] + iVar4;
        iVar6 = (uint)ptr_local[5] + iVar5;
        iVar7 = (uint)ptr_local[6] + iVar6;
        s1 = (uint)ptr_local[7] + iVar7;
        s2 = s1 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1 + s2;
        ptr_local = ptr_local + 8;
      }
      for (; i < block_len; i = i + 1) {
        s1 = *ptr_local + s1;
        s2 = s1 + s2;
        ptr_local = ptr_local + 1;
      }
      s1 = s1 % 0xfff1;
      s2 = s2 % 0xfff1;
      buf_len_local = buf_len_local - block_len;
      block_len = 0x15b0;
    }
    local_8 = (ulong)(s2 * 0x10000 + s1);
  }
  return local_8;
}

Assistant:

mz_ulong mz_adler32(mz_ulong adler, const unsigned char *ptr, size_t buf_len)
{
  mz_uint32 i, s1 = (mz_uint32)(adler & 0xffff), s2 = (mz_uint32)(adler >> 16); size_t block_len = buf_len % 5552;
  if (!ptr) return MZ_ADLER32_INIT;
  while (buf_len) {
    for (i = 0; i + 7 < block_len; i += 8, ptr += 8) {
      s1 += ptr[0], s2 += s1; s1 += ptr[1], s2 += s1; s1 += ptr[2], s2 += s1; s1 += ptr[3], s2 += s1;
      s1 += ptr[4], s2 += s1; s1 += ptr[5], s2 += s1; s1 += ptr[6], s2 += s1; s1 += ptr[7], s2 += s1;
    }
    for ( ; i < block_len; ++i) s1 += *ptr++, s2 += s1;
    s1 %= 65521U, s2 %= 65521U; buf_len -= block_len; block_len = 5552;
  }
  return (s2 << 16) + s1;
}